

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  FP *pFVar1;
  ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)1>_> *pPVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  MassType mass;
  FactorType factor;
  ChargeType charge;
  PositionType position;
  AssertHelper local_c0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_a0;
  double local_98;
  undefined1 *local_90;
  double local_88;
  double dStack_80;
  double local_78 [4];
  ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)1>_> *local_58;
  double local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  local_38 = &DAT_4008cccccccccccd;
  local_78[0] = -231300000000.0;
  local_78[1] = 0.0;
  local_78[2] = 1.23e-05;
  local_90 = &DAT_3a520b016873bbd3;
  local_40 = &DAT_be0080f172b1f37d;
  local_48 = &DAT_4061800000000000;
  local_88 = *pica::ParticleTypes::types;
  dStack_80 = 0.0;
  local_b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_4008cccccccccccd;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_a8,"position[d]","particle.getPosition()[d]",(double *)&local_38,
             (double *)&local_b8);
  if (local_a8.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (sStack_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x34,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (((local_b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_b8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_b8.ptr_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    local_58 = this;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_88 = local_88 * 29979245800.0;
    auVar8._8_8_ = local_88;
    auVar8._0_8_ = local_88;
    auVar8 = divpd(ZEXT816(0xc24aed46f4800000),auVar8);
    local_50 = 1.23e-05 / local_88;
    dVar7 = auVar8._8_8_;
    dVar6 = auVar8._0_8_;
    local_88 = dVar6 * 29979245800.0;
    dStack_80 = dVar7 * 29979245800.0;
    local_78[3] = 1.0 / SQRT(local_50 * local_50 + dVar6 * dVar6 + dVar7 * dVar7 + 1.0);
    local_50 = local_50 * 29979245800.0;
    lVar4 = 0;
    do {
      dVar6 = *pica::ParticleTypes::types;
      local_98 = local_50 * dVar6;
      local_a8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (dVar6 * local_88);
      sStack_a0.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(dVar6 * dStack_80);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_b8,"momentum[d]","particle.getMomentum()[d]",
                 (double *)((long)local_78 + lVar4),(double *)((long)&local_a8.ptr_ + lVar4));
      if (local_b8.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_a8);
        if (local_b0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((local_b0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x35,pcVar5);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (((local_a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
           (local_a8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_a8.ptr_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x18);
    local_b8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         *pica::ParticleTypes::types;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&local_a8,"mass","particle.getMass()",(double *)&local_90,
               (double *)&local_b8);
    if (local_a8.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      if (sStack_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((sStack_a0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x36,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (((local_b8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_b8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b8.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           pica::ParticleTypes::types[1];
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&local_a8,"charge","particle.getCharge()",(double *)&local_40,
                 (double *)&local_b8);
      pPVar2 = local_58;
      if (local_a8.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_b8);
        if (sStack_a0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((sStack_a0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x37,pcVar5);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (((local_b8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
           (local_b8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_b8.ptr_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        local_b8.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DAT_4061800000000000;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&local_a8,"factor","particle.getFactor()",(double *)&local_48,
                   (double *)&local_b8);
        if (local_a8.ptr_._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          if (sStack_a0.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((sStack_a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                     ,0x38,pcVar5);
          testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_c0);
          if (((local_b8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
             (local_b8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_b8.ptr_ + 8))();
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&sStack_a0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&sStack_a0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          dVar7 = SQRT((local_78[2] * local_78[2] +
                       local_78[0] * local_78[0] + local_78[1] * local_78[1]) /
                       ((double)local_90 * 29979245800.0 * (double)local_90 * 29979245800.0) + 1.0);
          (pPVar2->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
          super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.
          maxRelativeError = 1e-12;
          pFVar1 = &(pPVar2->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
                    super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture
                    .maxAbsoluteError;
          dVar6 = dVar7 - 1.0 / local_78[3];
          if (ABS(dVar7) < *pFVar1 || ABS(dVar7) == *pFVar1) {
            local_b8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ABS(dVar6);
            testing::internal::CmpHelperLE<double,double>
                      ((internal *)&local_a8,"fabs(expectedGamma - particle.getGamma())",
                       "this->maxAbsoluteError",(double *)&local_b8,
                       &(pPVar2->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
                        super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.
                        super_BaseFixture.maxAbsoluteError);
            if (local_a8.ptr_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_b8);
              if (sStack_a0.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = ((sStack_a0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                         ,0x3b,pcVar5);
              testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
              testing::internal::AssertHelper::~AssertHelper(&local_c0);
              if (((local_b8.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                  && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
                 (local_b8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_b8.ptr_ + 8))();
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&sStack_a0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&sStack_a0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
          }
          else {
            local_b8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ABS(dVar6 / dVar7);
            testing::internal::CmpHelperLE<double,double>
                      ((internal *)&local_a8,
                       "fabs(expectedGamma - particle.getGamma()) / fabs(expectedGamma)",
                       "this->maxRelativeError",(double *)&local_b8,
                       &(pPVar2->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
                        super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.
                        super_BaseFixture.maxRelativeError);
            if (local_a8.ptr_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_b8);
              if (sStack_a0.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = ((sStack_a0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                         ,0x3b,pcVar5);
              testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_b8);
              testing::internal::AssertHelper::~AssertHelper(&local_c0);
              if (((local_b8.ptr_ !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                  && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
                 (local_b8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_b8.ptr_ + 8))();
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&sStack_a0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&sStack_a0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Constructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(3.1, -32.1, 4.3e-5);
    MomentumType momentum(-231.3e9, 0.0, 1.23e-5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    FactorType factor = static_cast<FactorType>(1.4e2);

    ParticleType particle(position, momentum, factor, 0);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(factor, particle.getFactor());
    GammaType expectedGamma = sqrt((FP)1 + momentum.norm2() / sqr(mass * Constants<GammaType >::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}